

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  Nonnull<char_*> pcVar5;
  char *pcVar6;
  AlphaNum *in_R8;
  string_view message;
  string delimiter;
  string local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  iVar4 = this->recursion_limit_;
  this->recursion_limit_ = iVar4 + -1;
  if (iVar4 < 1) {
    local_e0._M_dataplus._M_p = (pointer)0x4b;
    local_e0._M_string_length = 0x47d60b;
    pcVar1 = local_b0.digits_;
    pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (this->initial_recursion_limit_,pcVar1);
    local_b0.piece_._M_len = (long)pcVar5 - (long)pcVar1;
    local_80.piece_._M_len = 1;
    local_80.piece_._M_str = ".";
    local_b0.piece_._M_str = pcVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_50,(lts_20250127 *)&local_e0,&local_b0,&local_80,in_R8);
    message._M_str = local_50._M_dataplus._M_p;
    message._M_len = local_50._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar3 = ConsumeMessageDelimiter(this,&local_e0);
    if (bVar3) {
      do {
        local_b0.piece_._M_len = (size_t)local_b0.digits_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,">","");
        pcVar6 = (char *)local_b0.piece_._M_len;
        pcVar1 = (char *)(this->tokenizer_).current_.text._M_string_length;
        if ((pcVar1 == local_b0.piece_._M_str) &&
           ((pcVar1 == (char *)0x0 ||
            (iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                          (void *)local_b0.piece_._M_len,(size_t)pcVar1), iVar4 == 0)))) {
          bVar3 = false;
        }
        else {
          local_80.piece_._M_len = (size_t)local_80.digits_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"}","");
          sVar2 = local_80.piece_._M_len;
          pcVar1 = (char *)(this->tokenizer_).current_.text._M_string_length;
          if (pcVar1 == local_80.piece_._M_str) {
            if (pcVar1 == (char *)0x0) {
              bVar3 = false;
            }
            else {
              iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                           (void *)local_80.piece_._M_len,(size_t)pcVar1);
              bVar3 = iVar4 != 0;
            }
          }
          else {
            bVar3 = true;
          }
          pcVar6 = (char *)local_b0.piece_._M_len;
          if ((char *)sVar2 != local_80.digits_) {
            operator_delete((void *)sVar2,local_80.digits_._0_8_ + 1);
            pcVar6 = (char *)local_b0.piece_._M_len;
          }
        }
        if (pcVar6 != local_b0.digits_) {
          operator_delete(pcVar6,local_b0.digits_._0_8_ + 1);
        }
        if (!bVar3) {
          bVar3 = Consume(this,&local_e0);
          if (bVar3) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar3 = true;
            goto LAB_002ff8c7;
          }
          break;
        }
        bVar3 = SkipField(this);
      } while (bVar3);
    }
    bVar3 = false;
LAB_002ff8c7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }